

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

int asl::myltoa(Long x,char *s)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  char *pcVar5;
  uint uVar6;
  bool bVar7;
  char local_29;
  char ss [32];
  
  if (x == 0) {
    *s = '0';
    uVar3 = 1;
    uVar2 = 1;
  }
  else {
    bVar7 = x < 0;
    if (bVar7) {
      *s = '-';
      x = -x;
    }
    uVar6 = (uint)bVar7;
    pcVar5 = &local_29;
    uVar3 = uVar6;
    for (; x != 0; x = (ulong)x / 10) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = x;
      pcVar5[1] = SUB161(auVar1 % ZEXT816(10),0) | 0x30;
      pcVar5 = pcVar5 + 1;
      uVar3 = uVar3 + 1;
    }
    uVar2 = (ulong)uVar3;
    for (uVar4 = (ulong)uVar6; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      s[uVar4] = *pcVar5;
      pcVar5 = pcVar5 + -1;
    }
  }
  s[uVar2] = '\0';
  return uVar3;
}

Assistant:

int myltoa(Long x, char* s)
{
	char ss[32];
	int i = 0, j = 0;
	if (x == 0)
	{
		s[0] = '0';
		s[1] = '\0';
		return 1;
	}
	if (x<0)
	{
		s[j++] = '-';
		x = -x;
	}
	while (x != 0) {
		ss[i++] = char(x % 10) + '0';
		x = x / 10;
	}
	while (i > 0)
		s[j++] = ss[--i];
	s[j] = '\0';
	return j;
}